

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeEnd>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeEnd> *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    anon_unknown_31::WebSocketPipeImpl::abort(*(WebSocketPipeImpl **)((long)pointer + 0x10));
    anon_unknown_31::WebSocketPipeImpl::abort(*(WebSocketPipeImpl **)((long)pointer + 0x20));
    plVar1 = *(long **)((long)pointer + 0x20);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)pointer + 0x10);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    operator_delete(pointer,0x28);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }